

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hh
# Opt level: O0

void __thiscall avro::StreamReader::more(StreamReader *this)

{
  bool bVar1;
  string *in_stack_ffffffffffffffa8;
  Exception *this_00;
  StreamReader *in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  bVar1 = fill(in_stack_ffffffffffffffb8);
  if (!bVar1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    Exception::Exception(this_00,in_stack_ffffffffffffffa8);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void more() {
        if (! fill()) {
            throw Exception("EOF reached");
        }
    }